

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test::testBody
          (TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test
           *this)

{
  MemoryReporterPluginUnderTest *pMVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  MockExpectedCall *pMVar4;
  undefined4 extraout_var_00;
  MemoryReportAllocator *pMVar5;
  undefined4 extraout_var_01;
  TestMemoryAllocator *pTVar6;
  undefined4 extraout_var_02;
  char *memory;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test *local_10
  ;
  TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test
  *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"formatter");
  pMVar3 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"report_test_start");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_40);
  SimpleString::SimpleString(&local_50,"result");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar2),&local_50,
                      (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_60,"test");
  MockExpectedCall::withParameter
            (pMVar4,&local_60,(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).test);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_70,"formatter");
  pMVar3 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"report_alloc_memory");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_80);
  SimpleString::SimpleString(&local_90,"result");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_00,iVar2),&local_90,
                      (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_a0,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_b0,"allocator");
  pMVar5 = MemoryReporterPlugin::getMallocAllocator
                     (&((this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter)->
                       super_MemoryReporterPlugin);
  (*pMVar4->_vptr_MockExpectedCall[5])(pMVar4,&local_a0,&local_b0,pMVar5);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::SimpleString(&local_c0,"formatter");
  pMVar3 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"report_free_memory");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_d0);
  SimpleString::SimpleString(&local_e0,"result");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_01,iVar2),&local_e0,
                      (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_f0,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_100,"allocator");
  pMVar5 = MemoryReporterPlugin::getMallocAllocator
                     (&((this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter)->
                       super_MemoryReporterPlugin);
  (*pMVar4->_vptr_MockExpectedCall[5])(pMVar4,&local_f0,&local_100,pMVar5);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString((SimpleString *)&memory,"formatter");
  pMVar3 = mock((SimpleString *)&memory,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x24])();
  SimpleString::~SimpleString((SimpleString *)&memory);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter;
  (*(pMVar1->super_MemoryReporterPlugin).super_TestPlugin._vptr_TestPlugin[2])
            (pMVar1,(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  pTVar6 = getCurrentMallocAllocator();
  iVar2 = (*pTVar6->_vptr_TestMemoryAllocator[8])(pTVar6,100);
  pTVar6 = getCurrentMallocAllocator();
  (*pTVar6->_vptr_TestMemoryAllocator[3])(pTVar6,CONCAT44(extraout_var_02,iVar2),100,"unknown",1);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed)
{
    mock("formatter").expectOneCall("report_test_start").withParameter("result", result).withParameter("test", test);
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentMallocAllocator()->allocMemoryLeakNode(100);
    getCurrentMallocAllocator()->free_memory(memory, 100, "unknown", 1);
}